

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O2

float basisu::B_spline_filter(float t)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -t;
  if (-t <= t) {
    fVar2 = t;
  }
  if (fVar2 < 1.0) {
    return (fVar2 * fVar2 * 0.5 * fVar2 - fVar2 * fVar2) + 0.6666667;
  }
  fVar1 = 0.0;
  if (fVar2 < 2.0) {
    fVar2 = 2.0 - fVar2;
    fVar1 = fVar2 * fVar2 * fVar2 * 0.16666667;
  }
  return fVar1;
}

Assistant:

static float B_spline_filter(float t) /* box (*) box (*) box (*) box */
	{
		float tt;

		if (t < 0.0f)
			t = -t;

		if (t < 1.0f)
		{
			tt = t * t;
			return ((.5f * tt * t) - tt + (2.0f / 3.0f));
		}
		else if (t < 2.0f)
		{
			t = 2.0f - t;
			return ((1.0f / 6.0f) * (t * t * t));
		}

		return (0.0f);
	}